

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analog.cxx
# Opt level: O0

void showTime(OledPixel *pixels)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  tm *ptVar4;
  long *in_RDI;
  double dVar5;
  double dVar6;
  double radians;
  int tick;
  double second;
  double minute;
  double hour;
  tm *tm;
  time_t now;
  Point<int> local_48;
  OledPixel *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  int iVar7;
  time_t local_10;
  long *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x10))();
  time(&local_10);
  ptVar4 = localtime(&local_10);
  dVar5 = (double)ptVar4->tm_sec / 60.0;
  drawHand(dVar5,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  drawHand(dVar5,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  drawHand(dVar5,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  for (iVar7 = 0; plVar1 = local_8, iVar7 < 0xc; iVar7 = iVar7 + 1) {
    dVar5 = ((double)iVar7 * 3.141592653589793) / 6.0;
    dVar6 = sin(dVar5);
    iVar2 = (**(code **)(*local_8 + 0x40))();
    dVar5 = cos(dVar5);
    iVar3 = (**(code **)(*local_8 + 0x48))();
    SSD1306::Point<int>::Point
              (&local_48,(int)(dVar6 * 31.0) + iVar2 / 2,(int)(dVar5 * 31.0) + iVar3 / 2);
    (**(code **)(*plVar1 + 0x28))(plVar1,local_48);
  }
  return;
}

Assistant:

void
showTime(
    SSD1306::OledPixel& pixels)
{
    //---------------------------------------------------------------------

    pixels.clear();

    //---------------------------------------------------------------------

    time_t now;
    time(&now);
    struct tm* tm = localtime(&now);

    //---------------------------------------------------------------------

    auto hour = (tm->tm_hour % 12) / 12.0;
    auto minute = tm->tm_min / 60.0;
    auto second = tm->tm_sec / 60.0;

    drawHand(hour + (minute / 12.0), HourHandLength, pixels);
    drawHand(minute + (second / 60.0), MinuteHandLength, pixels);
    drawHand(second, SecondHandLength, pixels);

    //---------------------------------------------------------------------

    for (auto tick = 0 ; tick < 12 ; ++tick)
    {
        auto radians = tick * M_PI / 6.0;
        pixels.setPixel(
            SSD1306::OledPoint(int(sin(radians) * TickRadius) +
                               (pixels.width() / 2),
                               int(cos(radians) * TickRadius) +
                               (pixels.height() / 2)));
    }

    //---------------------------------------------------------------------
}